

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O2

void __thiscall dg::llvmdg::legacy::NTSCD::compute(NTSCD *this,Function *F)

{
  Module *pMVar1;
  char cVar2;
  Module *pMVar3;
  Module *pMVar4;
  pair<std::_Rb_tree_iterator<const_llvm::Function_*>,_bool> pVar5;
  Function *local_40;
  Module *local_38;
  
  local_40 = F;
  if (((F != (Function *)0x0) && (cVar2 = llvm::GlobalValue::isDeclaration(), cVar2 == '\0')) &&
     (pVar5 = std::
              _Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
              ::_M_insert_unique<llvm::Function_const*const&>
                        ((_Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
                          *)&this->_computed,&local_40),
     ((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    dg::llvmdg::legacy::NTSCD::computeOnDemand((Function *)this);
    return;
  }
  pMVar1 = (this->super_LLVMControlDependenceAnalysisImpl)._module;
  for (pMVar3 = pMVar1 + 0x20; pMVar3 = *(Module **)pMVar3, pMVar3 != pMVar1 + 0x18;
      pMVar3 = pMVar3 + 8) {
    pMVar4 = pMVar3 + -0x38;
    if (pMVar3 == (Module *)0x0) {
      pMVar4 = (Module *)0x0;
    }
    cVar2 = llvm::GlobalValue::isDeclaration();
    if ((cVar2 == '\0') &&
       (local_38 = pMVar4,
       pVar5 = std::
               _Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
               ::_M_insert_unique<llvm::Function_const*>
                         ((_Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
                           *)&this->_computed,(Function **)&local_38),
       ((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
      dg::llvmdg::legacy::NTSCD::computeOnDemand((Function *)this);
    }
  }
  return;
}

Assistant:

void compute(const llvm::Function *F = nullptr) override {
        DBG(cda, "Triggering computation of all dependencies");
        if (F && !F->isDeclaration() && _computed.insert(F).second) {
            computeOnDemand(const_cast<llvm::Function *>(F));
        } else {
            for (const auto &f : *getModule()) {
                if (!f.isDeclaration() && _computed.insert(&f).second) {
                    computeOnDemand(const_cast<llvm::Function *>(&f));
                }
            }
        }
    }